

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

RPCHelpMan * getmemoryinfo(void)

{
  string name;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string cond;
  string cond_00;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string m_key_name_06;
  string m_key_name_07;
  string description_06;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_07;
  string description_08;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  RPCExamples examples;
  string description_09;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> results_00;
  undefined8 in_stack_fffffffffffff358;
  undefined8 in_stack_fffffffffffff360;
  undefined8 in_stack_fffffffffffff368;
  undefined8 in_stack_fffffffffffff370;
  _Manager_type in_stack_fffffffffffff378;
  undefined8 in_stack_fffffffffffff380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff388;
  pointer in_stack_fffffffffffff398;
  pointer pRVar2;
  pointer in_stack_fffffffffffff3a0;
  pointer pRVar3;
  pointer in_stack_fffffffffffff3a8;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff3b0;
  pointer in_stack_fffffffffffff3b8;
  pointer pRVar5;
  pointer in_stack_fffffffffffff3c0;
  pointer pRVar6;
  pointer in_stack_fffffffffffff3c8;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff3d0;
  pointer in_stack_fffffffffffff3d8;
  pointer pRVar8;
  pointer in_stack_fffffffffffff3e0;
  pointer pRVar9;
  pointer in_stack_fffffffffffff3e8;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff3f0;
  pointer in_stack_fffffffffffff3f8;
  pointer pRVar11;
  pointer in_stack_fffffffffffff400;
  pointer pRVar12;
  pointer in_stack_fffffffffffff408;
  undefined8 in_stack_fffffffffffff410;
  pointer in_stack_fffffffffffff418;
  pointer in_stack_fffffffffffff420;
  pointer in_stack_fffffffffffff428;
  undefined8 in_stack_fffffffffffff430;
  pointer in_stack_fffffffffffff438;
  allocator<char> local_baa;
  allocator<char> local_ba9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ba8;
  allocator<char> local_b8a;
  allocator<char> local_b89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b88;
  allocator<char> local_b6a;
  allocator<char> local_b69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b68;
  allocator<char> local_b4b;
  allocator<char> local_b4a;
  allocator<char> local_b49;
  RPCResults local_b48;
  allocator_type local_b2b;
  allocator<char> local_b2a;
  allocator<char> local_b29;
  vector<RPCArg,_std::allocator<RPCArg>_> local_b28;
  allocator<char> local_b0a;
  allocator<char> local_b09;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  char *local_a28;
  size_type local_a20;
  char local_a18 [8];
  undefined8 uStack_a10;
  string local_a08 [32];
  string local_9e8 [32];
  string local_9c8 [32];
  string local_9a8 [32];
  string local_988 [32];
  string local_968 [32];
  string local_948 [32];
  string local_928 [32];
  string local_908 [32];
  string local_8e8 [32];
  string local_8c8 [32];
  string local_8a8 [32];
  string local_888 [32];
  string local_868 [32];
  string local_848 [32];
  RPCResult local_828 [4];
  RPCResult local_608;
  RPCResult local_580;
  string local_4f8 [32];
  string local_4d8 [32];
  RPCResult local_4b8;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  RPCResult local_3d0 [2];
  RPCArgOptions local_2c0;
  string local_278 [32];
  UniValue local_258;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  string local_1a0 [32];
  RPCArg local_180;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getmemoryinfo",&local_b09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Returns an object containing information about memory usage.\n",&local_b0a);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"mode",&local_b29);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>(&local_258,(char (*) [6])0xcd3faa);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_200,&local_258);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,
             "determines what kind of information is returned.\n  - \"stats\" returns general statistics about memory usage in the daemon.\n  - \"mallocinfo\" returns an XML string describing low-level heap state (only available if compiled with glibc)."
             ,&local_b2a);
  local_2c0.oneline_description._M_dataplus._M_p = (pointer)&local_2c0.oneline_description.field_2;
  local_2c0.skip_type_check = false;
  local_2c0.oneline_description._M_string_length = 0;
  local_2c0.oneline_description.field_2._M_local_buf[0] = '\0';
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_2c0.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_2c0._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffff360;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  name.field_2._8_8_ = in_stack_fffffffffffff370;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff380;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff378;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff388;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff398;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff3a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff3a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff3b0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff3b8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff3c0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff3c8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff3d0;
  description_09._M_string_length = (size_type)in_stack_fffffffffffff3e0;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3d8;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff3e8;
  description_09.field_2._8_8_ = in_stack_fffffffffffff3f0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff400;
  opts._0_8_ = in_stack_fffffffffffff3f8;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff408;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff410;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff418;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff420;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff428;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff430;
  opts._64_8_ = in_stack_fffffffffffff438;
  RPCArg::RPCArg(&local_180,name,(Type)local_1a0,fallback,description_09,opts);
  __l._M_len = 1;
  __l._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_b28,__l,&local_b2b);
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"mode \"stats\"",&local_b49);
  std::__cxx11::string::string<std::allocator<char>>(local_410,"",&local_b4a);
  std::__cxx11::string::string<std::allocator<char>>(local_430,"",&local_b4b);
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"locked",&local_b69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,"Information about locked memory manager",&local_b6a);
  std::__cxx11::string::string<std::allocator<char>>(local_848,"used",&local_b89);
  std::__cxx11::string::string<std::allocator<char>>(local_868,"Number of bytes used",&local_b8a);
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff360;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff370;
  description._M_string_length = in_stack_fffffffffffff380;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description.field_2 = in_stack_fffffffffffff388;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff3a0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff398;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(local_828,NUM,m_key_name,description,inner,SUB81(local_848,0));
  std::__cxx11::string::string<std::allocator<char>>(local_888,"free",&local_ba9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a8,"Number of bytes available in current arenas",&local_baa);
  m_key_name_00._M_string_length = in_stack_fffffffffffff360;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff370;
  description_00._M_string_length = in_stack_fffffffffffff380;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_00.field_2 = in_stack_fffffffffffff388;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(local_828 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_888,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c8,"total",(allocator<char> *)&stack0xfffffffffffff437);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e8,"Total number of bytes managed",(allocator<char> *)&stack0xfffffffffffff436);
  m_key_name_01._M_string_length = in_stack_fffffffffffff360;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff370;
  description_01._M_string_length = in_stack_fffffffffffff380;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_01.field_2 = in_stack_fffffffffffff388;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(local_828 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_8c8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_908,"locked",(allocator<char> *)&stack0xfffffffffffff417);
  std::__cxx11::string::string<std::allocator<char>>
            (local_928,
             "Amount of bytes that succeeded locking. If this number is smaller than total, locking pages failed at some point and key data could be swapped to disk."
             ,(allocator<char> *)&stack0xfffffffffffff416);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff360;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff370;
  description_02._M_string_length = in_stack_fffffffffffff380;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_02.field_2 = in_stack_fffffffffffff388;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(local_828 + 3,NUM,m_key_name_02,description_02,inner_02,SUB81(local_908,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_948,"chunks_used",(allocator<char> *)&stack0xfffffffffffff3f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_968,"Number allocated chunks",(allocator<char> *)&stack0xfffffffffffff3f6);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff360;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff370;
  description_03._M_string_length = in_stack_fffffffffffff380;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_03.field_2 = in_stack_fffffffffffff388;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(&local_608,NUM,m_key_name_03,description_03,inner_03,SUB81(local_948,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_988,"chunks_free",(allocator<char> *)&stack0xfffffffffffff3d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9a8,"Number unused chunks",(allocator<char> *)&stack0xfffffffffffff3d6);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_04._M_string_length = in_stack_fffffffffffff360;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff370;
  description_04._M_string_length = in_stack_fffffffffffff380;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_04.field_2._M_local_buf = in_stack_fffffffffffff388._M_local_buf;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(&local_580,NUM,m_key_name_04,description_04,inner_04,SUB81(local_988,0));
  __l_00._M_len = 6;
  __l_00._M_array = local_828;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_b88,__l_00,(allocator_type *)&stack0xfffffffffffff3b7);
  m_key_name_05._M_string_length = in_stack_fffffffffffff360;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff370;
  description_05._M_string_length = in_stack_fffffffffffff380;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  description_05.field_2 = in_stack_fffffffffffff388;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff3a0;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff398;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff3a8;
  RPCResult::RPCResult(&local_4b8,OBJ,m_key_name_05,description_05,inner_05,SUB81(local_4d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_4b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_b68,__l_01,(allocator_type *)&stack0xfffffffffffff3b6);
  cond._M_string_length = in_stack_fffffffffffff360;
  cond._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  cond.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  cond.field_2._8_8_ = in_stack_fffffffffffff370;
  m_key_name_06._M_string_length = in_stack_fffffffffffff380;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  m_key_name_06.field_2 = in_stack_fffffffffffff388;
  description_07._M_string_length = (size_type)in_stack_fffffffffffff3a0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff398;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff3a8;
  description_07.field_2._8_8_ = in_stack_fffffffffffff3b0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult(local_3d0,cond,(Type)local_3f0,m_key_name_06,description_07,inner_06);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c8,"mode \"mallocinfo\"",(allocator<char> *)&stack0xfffffffffffff3b5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9e8,"",(allocator<char> *)&stack0xfffffffffffff3b4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a08,"\"<malloc version=\"1\">...\"",(allocator<char> *)&stack0xfffffffffffff3b3);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  cond_00._M_string_length = in_stack_fffffffffffff360;
  cond_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff358;
  cond_00.field_2._M_allocated_capacity = in_stack_fffffffffffff368;
  cond_00.field_2._8_8_ = in_stack_fffffffffffff370;
  m_key_name_07._M_string_length = in_stack_fffffffffffff380;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff378;
  m_key_name_07.field_2 = in_stack_fffffffffffff388;
  description_08.field_2._M_allocated_capacity = 0;
  description_08._M_dataplus._M_p = (pointer)0x0;
  description_08._M_string_length = 0;
  description_08.field_2._8_8_ = in_stack_fffffffffffff3b0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar6;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar5;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar7;
  RPCResult::RPCResult(local_3d0 + 1,cond_00,(Type)local_9c8,m_key_name_07,description_08,inner_07);
  results_00._M_len = 2;
  results_00._M_array = local_3d0;
  RPCResults::RPCResults(&local_b48,results_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,"getmemoryinfo",(allocator<char> *)&stack0xfffffffffffff397);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"",(allocator<char> *)&stack0xfffffffffffff396);
  HelpExampleCli(&local_a68,&local_a88,&local_aa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae8,"getmemoryinfo",(allocator<char> *)&stack0xfffffffffffff395);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"",(allocator<char> *)&stack0xfffffffffffff394);
  HelpExampleRpc(&local_ac8,&local_ae8,&local_b08);
  std::operator+(&local_a48,&local_a68,&local_ac8);
  local_a28 = local_a18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a48._M_dataplus._M_p == &local_a48.field_2) {
    uStack_a10 = local_a48.field_2._8_8_;
  }
  else {
    local_a28 = local_a48._M_dataplus._M_p;
  }
  local_a20 = local_a48._M_string_length;
  local_a48._M_string_length = 0;
  local_a48.field_2._M_local_buf[0] = '\0';
  description_06._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/node.cpp:175:9)>
       ::_M_invoke;
  description_06._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/node.cpp:175:9)>
                ::_M_manager;
  description_06.field_2 = in_stack_fffffffffffff388;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff3b0;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff3d0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff3f0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_a48._M_dataplus._M_p = (pointer)&local_a48.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff360,&stack0xfffffffffffff368)),
             description_06,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff368);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b48.m_results);
  lVar1 = 0x88;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_3d0[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff398);
  std::__cxx11::string::~string(local_a08);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_9c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b68);
  RPCResult::~RPCResult(&local_4b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b88);
  lVar1 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_828[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff3b8);
  std::__cxx11::string::~string(local_9a8);
  std::__cxx11::string::~string(local_988);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff3d8);
  std::__cxx11::string::~string(local_968);
  std::__cxx11::string::~string(local_948);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff3f8);
  std::__cxx11::string::~string(local_928);
  std::__cxx11::string::~string(local_908);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff418);
  std::__cxx11::string::~string(local_8e8);
  std::__cxx11::string::~string(local_8c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff438);
  std::__cxx11::string::~string(local_8a8);
  std::__cxx11::string::~string(local_888);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ba8);
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_848);
  std::__cxx11::string::~string(local_4f8);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_430);
  std::__cxx11::string::~string(local_410);
  std::__cxx11::string::~string(local_3f0);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_b28);
  RPCArg::~RPCArg(&local_180);
  RPCArgOptions::~RPCArgOptions(&local_2c0);
  std::__cxx11::string::~string(local_278);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_200);
  UniValue::~UniValue(&local_258);
  std::__cxx11::string::~string(local_1a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getmemoryinfo()
{
    /* Please, avoid using the word "pool" here in the RPC interface or help,
     * as users will undoubtedly confuse it with the other "memory pool"
     */
    return RPCHelpMan{"getmemoryinfo",
                "Returns an object containing information about memory usage.\n",
                {
                    {"mode", RPCArg::Type::STR, RPCArg::Default{"stats"}, "determines what kind of information is returned.\n"
            "  - \"stats\" returns general statistics about memory usage in the daemon.\n"
            "  - \"mallocinfo\" returns an XML string describing low-level heap state (only available if compiled with glibc)."},
                },
                {
                    RPCResult{"mode \"stats\"",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::OBJ, "locked", "Information about locked memory manager",
                            {
                                {RPCResult::Type::NUM, "used", "Number of bytes used"},
                                {RPCResult::Type::NUM, "free", "Number of bytes available in current arenas"},
                                {RPCResult::Type::NUM, "total", "Total number of bytes managed"},
                                {RPCResult::Type::NUM, "locked", "Amount of bytes that succeeded locking. If this number is smaller than total, locking pages failed at some point and key data could be swapped to disk."},
                                {RPCResult::Type::NUM, "chunks_used", "Number allocated chunks"},
                                {RPCResult::Type::NUM, "chunks_free", "Number unused chunks"},
                            }},
                        }
                    },
                    RPCResult{"mode \"mallocinfo\"",
                        RPCResult::Type::STR, "", "\"<malloc version=\"1\">...\""
                    },
                },
                RPCExamples{
                    HelpExampleCli("getmemoryinfo", "")
            + HelpExampleRpc("getmemoryinfo", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::string mode = request.params[0].isNull() ? "stats" : request.params[0].get_str();
    if (mode == "stats") {
        UniValue obj(UniValue::VOBJ);
        obj.pushKV("locked", RPCLockedMemoryInfo());
        return obj;
    } else if (mode == "mallocinfo") {
#ifdef HAVE_MALLOC_INFO
        return RPCMallocInfo();
#else
        throw JSONRPCError(RPC_INVALID_PARAMETER, "mallocinfo mode not available");
#endif
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "unknown mode " + mode);
    }
},
    };
}